

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

DdNode * Cudd_Decreasing(DdManager *dd,DdNode *f,int i)

{
  uint uVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *local_68;
  uint local_5c;
  DD_CTFP cacheOp;
  DdNode *res;
  DdNode *fvn;
  DdNode *fv;
  DdNode *F;
  uint level;
  uint topf;
  int i_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar3 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if (pDVar3->index == 0x7fffffff) {
    local_5c = pDVar3->index;
  }
  else {
    local_5c = dd->perm[pDVar3->index];
  }
  uVar1 = dd->perm[i];
  if (uVar1 < local_5c) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2(dd,Cudd_Decreasing,f,dd->vars[i]);
    if (dd_local == (DdManager *)0x0) {
      fvn = (pDVar3->type).kids.T;
      res = (pDVar3->type).kids.E;
      if (pDVar3 != f) {
        fvn = (DdNode *)((ulong)fvn ^ 1);
        res = (DdNode *)((ulong)res ^ 1);
      }
      if (local_5c == uVar1) {
        if ((((ulong)fvn & 1) == 0) && (((ulong)res & 1) != 0)) {
          return (DdNode *)((ulong)dd->one ^ 1);
        }
        iVar2 = Cudd_bddLeq(dd,fvn,res);
        if (iVar2 == 0) {
          local_68 = (DdNode *)((ulong)dd->one ^ 1);
        }
        else {
          local_68 = dd->one;
        }
        cacheOp = (DD_CTFP)local_68;
      }
      else {
        cacheOp = (DD_CTFP)Cudd_Decreasing(dd,fvn,i);
        if ((DdNode *)cacheOp == dd->one) {
          cacheOp = (DD_CTFP)Cudd_Decreasing(dd,res,i);
        }
      }
      cuddCacheInsert2(dd,Cudd_Decreasing,f,dd->vars[i],(DdNode *)cacheOp);
      dd_local = (DdManager *)cacheOp;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Decreasing(
  DdManager * dd,
  DdNode * f,
  int  i)
{
    unsigned int topf, level;
    DdNode *F, *fv, *fvn, *res;
    DD_CTFP cacheOp;

    statLine(dd);
#ifdef DD_DEBUG
    assert(0 <= i && i < dd->size);
#endif

    F = Cudd_Regular(f);
    topf = cuddI(dd,F->index);

    /* Check terminal case. If topf > i, f does not depend on var.
    ** Therefore, f is unate in i.
    */
    level = (unsigned) dd->perm[i];
    if (topf > level) {
        return(DD_ONE(dd));
    }

    /* From now on, f is not constant. */

    /* Check cache. */
    cacheOp = (DD_CTFP) Cudd_Decreasing;
    res = cuddCacheLookup2(dd,cacheOp,f,dd->vars[i]);
    if (res != NULL) {
        return(res);
    }

    /* Compute cofactors. */
    fv = cuddT(F); fvn = cuddE(F);
    if (F != f) {
        fv = Cudd_Not(fv);
        fvn = Cudd_Not(fvn);
    }

    if (topf == (unsigned) level) {
        /* Special case: if fv is regular, fv(1,...,1) = 1;
        ** If in addition fvn is complemented, fvn(1,...,1) = 0.
        ** But then f(1,1,...,1) > f(0,1,...,1). Hence f is not
        ** monotonic decreasing in i.
        */
        if (!Cudd_IsComplement(fv) && Cudd_IsComplement(fvn)) {
            return(Cudd_Not(DD_ONE(dd)));
        }
        res = Cudd_bddLeq(dd,fv,fvn) ? DD_ONE(dd) : Cudd_Not(DD_ONE(dd));
    } else {
        res = Cudd_Decreasing(dd,fv,i);
        if (res == DD_ONE(dd)) {
            res = Cudd_Decreasing(dd,fvn,i);
        }
    }

    cuddCacheInsert2(dd,cacheOp,f,dd->vars[i],res);
    return(res);

}